

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

void sho_obj_return_to_u(obj *obj,schar dx,schar dy)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = (int)bhitpos.x;
  if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
    return;
  }
  iVar3 = (int)bhitpos.y;
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_0017f2f5:
    iVar4 = (int)obj->otyp;
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar1 = dmgtype(youmonst.data,0x24);
      if (bVar1 != '\0') goto LAB_0017f2f5;
    }
    iVar4 = display_rng(0x219);
    iVar4 = iVar4 + 1;
  }
  tmp_at(-4,iVar4 + 1);
  iVar2 = iVar2 - dx;
  for (iVar3 = iVar3 - dy; (iVar2 != u.ux || (iVar3 != u.uy)); iVar3 = iVar3 - dy) {
    tmp_at(iVar2,iVar3);
    (*windowprocs.win_delay)();
    iVar2 = iVar2 - dx;
  }
  tmp_at(-6,0);
  return;
}

Assistant:

static void sho_obj_return_to_u(struct obj *obj, schar dx, schar dy)
{
    /* might already be our location (bounced off a wall) */
    if (bhitpos.x != u.ux || bhitpos.y != u.uy) {
	int x = bhitpos.x - dx;
	int y = bhitpos.y - dy;
	
	tmp_at(DISP_OBJECT, dbuf_objid(obj));
	while (x != u.ux || y != u.uy) {
	    tmp_at(x, y);
	    win_delay_output();
	    x -= dx; y -= dy;
	}
	tmp_at(DISP_END, 0);
    }
}